

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nsh_history.cpp
# Opt level: O2

void __thiscall
NshHistoryAddEntry_SuccessWhenOverriding_Test::NshHistoryAddEntry_SuccessWhenOverriding_Test
          (NshHistoryAddEntry_SuccessWhenOverriding_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00161dc0;
  return;
}

Assistant:

TEST(NshHistoryAddEntry, SuccessWhenOverriding)
{
    nsh_history_t hist;
    nsh_history_reset(&hist);

    const char new_entry[] = "new_entry";
    for (unsigned int i = 0; i < NSH_CMD_HISTORY_SIZE; i++) {
        nsh_history_add_entry(&hist, new_entry);
    }

    ASSERT_EQ(hist.size, NSH_CMD_HISTORY_SIZE);
    ASSERT_EQ(hist.head, 0);
    ASSERT_EQ(hist.tail, 0);

    const char entry_override[] = "overriden";
    nsh_history_add_entry(&hist, entry_override);

    ASSERT_EQ(hist.size, NSH_CMD_HISTORY_SIZE);
    ASSERT_EQ(hist.head, 1);
    ASSERT_EQ(hist.tail, 1);
    ASSERT_STREQ(hist.entries[0], entry_override);
    ASSERT_STREQ(hist.entries[1], new_entry);
}